

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

BCReg const_gc(FuncState *fs,GCobj *gc,uint32_t itype)

{
  TValue *pTVar1;
  TValue TVar2;
  undefined4 in_EDX;
  GCtab *in_RSI;
  lua_State *in_RDI;
  TValue *o;
  TValue key;
  lua_State *L;
  undefined4 in_stack_ffffffffffffff98;
  BCReg local_50;
  
  pTVar1 = lj_tab_set(in_RDI,in_RSI,(cTValue *)CONCAT44(in_EDX,in_stack_ffffffffffffff98));
  if ((pTVar1->field_2).it == 0) {
    local_50 = (pTVar1->u32).lo;
  }
  else {
    TVar2.field_2.it = 0;
    TVar2.field_2.field_0 =
         (anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0)
         in_RDI[1].nextgc.gcptr32;
    *pTVar1 = TVar2;
    local_50 = in_RDI[1].nextgc.gcptr32;
    in_RDI[1].nextgc.gcptr32 = local_50 + 1;
  }
  return local_50;
}

Assistant:

static BCReg const_gc(FuncState *fs, GCobj *gc, uint32_t itype)
{
  lua_State *L = fs->L;
  TValue key, *o;
  setgcV(L, &key, gc, itype);
  /* NOBARRIER: the key is new or kept alive. */
  o = lj_tab_set(L, fs->kt, &key);
  if (tvhaskslot(o))
    return tvkslot(o);
  o->u64 = fs->nkgc;
  return fs->nkgc++;
}